

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O0

brick_volume * idx2::PointQuery(brick_volume *__return_storage_ptr__,brick_pool *Bp,v3i *P3)

{
  v3i *P3_local;
  brick_pool *Bp_local;
  
  memset(__return_storage_ptr__,0,0x40);
  brick_volume::brick_volume(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

brick_volume
PointQuery(const brick_pool& Bp, v3i* P3)
{
  return brick_volume();
}